

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int __thiscall
CLIntercept::CopyBuffer
          (CLIntercept *this,cl_command_queue commandQueue,cl_mem srcBuffer,cl_mem dstBuffer,
          size_t srcOffset,size_t dstOffset,size_t bytesToCopy,cl_uint numEventsInWaitList,
          cl_event *eventWaitList,cl_event *event)

{
  cl_int cVar1;
  cl_icd_dispatch *pcVar2;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  size_t unaff_R14;
  cl_mem unaff_R15;
  cl_mem unaff_retaddr;
  cl_command_queue in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  CLIntercept *in_stack_00000018;
  size_t in_stack_00000030;
  size_t in_stack_00000038;
  cl_uint in_stack_00000040;
  cl_event *in_stack_00000048;
  cl_event *in_stack_00000050;
  cl_context context;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff48;
  lock_guard<std::mutex> *in_stack_ffffffffffffff50;
  undefined8 local_60;
  cl_int local_54;
  cl_command_queue local_28;
  
  local_28 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_54 = 0;
  local_60 = 0;
  pcVar2 = dispatch(in_RDI);
  local_54 = (*pcVar2->clGetCommandQueueInfo)(local_28,0x1090,8,&local_60,(size_t *)0x0);
  if (local_54 == 0) {
    local_54 = CopyBufferHelper(in_stack_00000018,
                                (cl_context)CONCAT44(in_stack_00000014,in_stack_00000010),
                                in_stack_00000008,unaff_retaddr,unaff_R15,unaff_R14,
                                in_stack_00000030,in_stack_00000038,in_stack_00000040,
                                in_stack_00000048,in_stack_00000050);
  }
  cVar1 = local_54;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21d699);
  return cVar1;
}

Assistant:

cl_int CLIntercept::CopyBuffer(
    cl_command_queue commandQueue,
    cl_mem srcBuffer,
    cl_mem dstBuffer,
    size_t srcOffset,
    size_t dstOffset,
    size_t bytesToCopy,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_context  context = NULL;

    // Get the context for this command queue.
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetCommandQueueInfo(
            commandQueue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = CopyBufferHelper(
            context,
            commandQueue,
            srcBuffer,
            dstBuffer,
            srcOffset,
            dstOffset,
            bytesToCopy,
            numEventsInWaitList,
            eventWaitList,
            event );
    }

    return errorCode;
}